

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O3

bool __thiscall gl4cts::DirectStateAccess::Framebuffers::BlitTest::Test(BlitTest *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0x78))(0x8d40,this->m_fbo_src);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glBindFramebuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xb01);
  ClearFramebuffer(this,1.0,0.0,0.0,0.5,1);
  (**(code **)(lVar4 + 0x148))(this->m_fbo_src,this->m_fbo_dst,0,0,1,1,0,0,1,1,0x4500,0x2600);
  bVar1 = CheckErrorAndLog(this);
  if (bVar1) {
    ClearFramebuffer(this,0.0,1.0,0.0,0.25,2);
    (**(code **)(lVar4 + 0x148))(this->m_fbo_src,this->m_fbo_dst,0,0,1,1,1,0,2,1,0x4000,0x2601);
    (**(code **)(lVar4 + 0x148))(this->m_fbo_src,this->m_fbo_dst,0,0,1,1,1,0,2,1,0x500,0x2600);
    bVar1 = CheckErrorAndLog(this);
    if (bVar1) {
      ClearFramebuffer(this,0.0,0.0,1.0,0.125,3);
      (**(code **)(lVar4 + 0x148))(this->m_fbo_src,this->m_fbo_dst,0,0,2,2,2,0,3,1,0x4500,0x2600);
      bVar1 = CheckErrorAndLog(this);
      if (bVar1) {
        ClearFramebuffer(this,1.0,1.0,0.0,0.0625,4);
        (**(code **)(lVar4 + 0x148))(this->m_fbo_src,this->m_fbo_dst,0,0,1,1,0,1,3,2,0x4500,0x2600);
        bVar1 = CheckErrorAndLog(this);
        if (bVar1) {
          (**(code **)(lVar4 + 0x78))(0x8d40,this->m_fbo_dst);
          dVar3 = (**(code **)(lVar4 + 0x800))();
          glu::checkError(dVar3,"glBindFramebuffer has failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                          ,0xb21);
          bVar1 = CheckColor(this);
          if (((bVar1) && (bVar1 = CheckDepth(this), bVar1)) && (bVar1 = CheckStencil(this), bVar1))
          {
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool BlitTest::Test()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_src);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

	ClearFramebuffer(1.f, 0.f, 0.f, 0.5f, 1);

	gl.blitNamedFramebuffer(m_fbo_src, m_fbo_dst, 0, 0, 1, 1, 0, 0, 1, 1,
							GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT, GL_NEAREST);

	if (CheckErrorAndLog())
	{
		ClearFramebuffer(0.f, 1.f, 0.f, 0.25f, 2);

		gl.blitNamedFramebuffer(m_fbo_src, m_fbo_dst, 0, 0, 1, 1, 1, 0, 2, 1, GL_COLOR_BUFFER_BIT, GL_LINEAR);
		gl.blitNamedFramebuffer(m_fbo_src, m_fbo_dst, 0, 0, 1, 1, 1, 0, 2, 1,
								GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT, GL_NEAREST);

		if (CheckErrorAndLog())
		{
			ClearFramebuffer(0.f, 0.f, 1.f, 0.125f, 3);

			gl.blitNamedFramebuffer(m_fbo_src, m_fbo_dst, 0, 0, 2, 2, 2, 0, 3, 1,
									GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT, GL_NEAREST);

			if (CheckErrorAndLog())
			{
				ClearFramebuffer(1.f, 1.f, 0.f, 0.0625f, 4);

				gl.blitNamedFramebuffer(m_fbo_src, m_fbo_dst, 0, 0, 1, 1, 0, 1, 3, 2,
										GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT, GL_NEAREST);

				if (CheckErrorAndLog())
				{
					gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_dst);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

					if (CheckColor() && CheckDepth() && CheckStencil())
					{
						return true;
					}
				}
			}
		}
	}

	return false;
}